

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPostDepthCoverageTests.cpp
# Opt level: O3

void __thiscall
gl4cts::PostDepthSampleMaskCase::PostDepthSampleMaskCase
          (PostDepthSampleMaskCase *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"PostDepthSampleMask",
             "Verifies multisampling with depth test and stencil test functionality added in ARB_post_depth_coverage extension"
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__PostDepthSampleMaskCase_020e2b38;
  this->m_framebufferMS = 0;
  this->m_framebuffer = 0;
  this->m_textureMS = 0;
  this->m_texture = 0;
  this->m_depthStencilRenderbuffer = 0;
  (this->m_vertShader)._M_dataplus._M_p = (pointer)&(this->m_vertShader).field_2;
  (this->m_vertShader)._M_string_length = 0;
  (this->m_vertShader).field_2._M_local_buf[0] = '\0';
  (this->m_fragShader1a)._M_dataplus._M_p = (pointer)&(this->m_fragShader1a).field_2;
  (this->m_fragShader1a)._M_string_length = 0;
  (this->m_fragShader1a).field_2._M_local_buf[0] = '\0';
  (this->m_fragShader1b)._M_dataplus._M_p = (pointer)&(this->m_fragShader1b).field_2;
  (this->m_fragShader1b)._M_string_length = 0;
  (this->m_fragShader1b).field_2._M_local_buf[0] = '\0';
  (this->m_fragShader2)._M_dataplus._M_p = (pointer)&(this->m_fragShader2).field_2;
  (this->m_fragShader2)._M_string_length = 0;
  (this->m_fragShader2).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

PostDepthSampleMaskCase::PostDepthSampleMaskCase(deqp::Context& context)
	: TestCase(context, "PostDepthSampleMask", "Verifies multisampling with depth test and stencil test functionality "
											   "added in ARB_post_depth_coverage extension")
	, m_framebufferMS(0)
	, m_framebuffer(0)
	, m_textureMS(0)
	, m_texture(0)
	, m_depthStencilRenderbuffer(0)
{
	/* Left blank intentionally */
}